

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadSignatureTypeSection(WasmBinaryReader *this)

{
  char cVar1;
  bool bVar2;
  uint count;
  uint32 uVar3;
  uint uVar4;
  WasmType WVar5;
  uint sourceContextId;
  LocalFunctionId functionId;
  WasmSignature *this_00;
  Recycler *pRVar6;
  FunctionBody *pFVar7;
  uint local_40;
  WasmType type_1;
  uint32 iResult;
  uint32 resultCount;
  WasmType type;
  ArgSlot j;
  ArgSlot paramCount;
  uint32 paramCount32;
  int8 form;
  WasmSignature *sig;
  uint32 i;
  uint32 numTypes;
  uint32 len;
  WasmBinaryReader *this_local;
  
  i = 0;
  _numTypes = this;
  count = LEB128<unsigned_int,32u>(this,&i);
  uVar3 = Limits::GetMaxTypes();
  if (uVar3 < count) {
    ThrowDecodingError(this,L"Too many signatures");
  }
  Js::WebAssemblyModule::SetSignatureCount(this->m_module,count);
  sig._4_4_ = 0;
  do {
    if (count <= sig._4_4_) {
      return;
    }
    this_00 = Js::WebAssemblyModule::GetSignature(this->m_module,sig._4_4_);
    WasmSignature::SetSignatureId(this_00,sig._4_4_);
    cVar1 = SLEB128<char,7u>(this,&i);
    if (cVar1 != -0x20) {
      ThrowDecodingError(this,L"Unexpected type form 0x%X",(ulong)(uint)(int)cVar1);
    }
    uVar4 = LEB128<unsigned_int,32u>(this,&i);
    uVar3 = Limits::GetMaxFunctionParams();
    if ((uVar3 < uVar4) || (0xffff < uVar4)) {
      ThrowDecodingError(this,L"Too many arguments in signature");
    }
    pRVar6 = Js::RecyclableObject::GetRecycler((RecyclableObject *)this->m_module);
    WasmSignature::AllocateParams(this_00,(ArgSlot)uVar4,pRVar6);
    for (resultCount._0_2_ = 0; (ushort)resultCount < (ArgSlot)uVar4;
        resultCount._0_2_ = (ushort)resultCount + 1) {
      WVar5 = ReadWasmType(this,&i);
      WasmSignature::SetParam(this_00,WVar5,(ushort)resultCount);
    }
    uVar4 = LEB128<unsigned_int,32u>(this,&i);
    uVar3 = Limits::GetMaxFunctionReturns();
    if (uVar3 < uVar4) {
      uVar3 = Limits::GetMaxFunctionReturns();
      ThrowDecodingError(this,L"Too many returns in signature: %u. Maximum allowed: %u",(ulong)uVar4
                         ,(ulong)uVar3);
    }
    pRVar6 = Js::RecyclableObject::GetRecycler((RecyclableObject *)this->m_module);
    WasmSignature::AllocateResults(this_00,uVar4,pRVar6);
    for (local_40 = 0; local_40 < uVar4; local_40 = local_40 + 1) {
      WVar5 = ReadWasmType(this,&i);
      WasmSignature::SetResult(this_00,WVar5,local_40);
    }
    WasmSignature::FinalizeSignature(this_00);
    pFVar7 = GetFunctionBody(this);
    if (pFVar7 == (FunctionBody *)0x0) {
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase);
      if (bVar2) goto LAB_0160a48b;
    }
    else {
      pFVar7 = GetFunctionBody(this);
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
      pFVar7 = GetFunctionBody(this);
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01ec1678,WasmReaderPhase,sourceContextId,functionId);
      if (bVar2) {
LAB_0160a48b:
        Output::Print(L"Signature #%u: ",(ulong)sig._4_4_);
        WasmSignature::Dump(this_00,0x200);
        Output::Print(L"\n");
      }
    }
    sig._4_4_ = sig._4_4_ + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::ReadSignatureTypeSection()
{
    uint32 len = 0;
    const uint32 numTypes = LEB128(len);
    if (numTypes > Limits::GetMaxTypes())
    {
        ThrowDecodingError(_u("Too many signatures"));
    }

    m_module->SetSignatureCount(numTypes);
    // signatures table
    for (uint32 i = 0; i < numTypes; i++)
    {
        WasmSignature* sig = m_module->GetSignature(i);
        sig->SetSignatureId(i);
        int8 form = SLEB128<int8, 7>(len);
        if (form != LanguageTypes::func)
        {
            ThrowDecodingError(_u("Unexpected type form 0x%X"), form);
        }

        uint32 paramCount32 = LEB128(len);
        if (paramCount32 > Limits::GetMaxFunctionParams() || paramCount32 > UINT16_MAX)
        {
            ThrowDecodingError(_u("Too many arguments in signature"));
        }

        Js::ArgSlot paramCount = (Js::ArgSlot)paramCount32;
        sig->AllocateParams(paramCount, m_module->GetRecycler());
        for (Js::ArgSlot j = 0; j < paramCount; j++)
        {
            WasmTypes::WasmType type = ReadWasmType(len);
            sig->SetParam(type, j);
        }

        uint32 resultCount = LEB128(len);
        if (resultCount > Limits::GetMaxFunctionReturns())
        {
            ThrowDecodingError(_u("Too many returns in signature: %u. Maximum allowed: %u"), resultCount, Limits::GetMaxFunctionReturns());
        }
        sig->AllocateResults(resultCount, m_module->GetRecycler());
        for (uint32 iResult = 0; iResult < resultCount; ++iResult)
        {
            WasmTypes::WasmType type = ReadWasmType(len);
            sig->SetResult(type, iResult);
        }
        sig->FinalizeSignature();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (DO_WASM_TRACE_DECODER)
        {
            Output::Print(_u("Signature #%u: "), i);
            sig->Dump();
            Output::Print(_u("\n"));
        }
#endif
    }
}